

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::ReduceLogSumExpLayerParams::ReduceLogSumExpLayerParams
          (ReduceLogSumExpLayerParams *this,ReduceLogSumExpLayerParams *from)

{
  ulong uVar1;
  bool bVar2;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__ReduceLogSumExpLayerParams_004b8c90;
  google::protobuf::RepeatedField<long>::RepeatedField(&this->axes_,&from->axes_);
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  bVar2 = from->reduceall_;
  this->keepdims_ = from->keepdims_;
  this->reduceall_ = bVar2;
  return;
}

Assistant:

ReduceLogSumExpLayerParams::ReduceLogSumExpLayerParams(const ReduceLogSumExpLayerParams& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      axes_(from.axes_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  ::memcpy(&keepdims_, &from.keepdims_,
    static_cast<size_t>(reinterpret_cast<char*>(&reduceall_) -
    reinterpret_cast<char*>(&keepdims_)) + sizeof(reduceall_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.ReduceLogSumExpLayerParams)
}